

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O2

string * Console::
         NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::get(string *__return_storage_ptr__,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *argumentNames,uint nextName,uint requiredArguments)

{
  pointer pbVar1;
  bool bVar2;
  ulong uVar3;
  string nameT;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  bVar2 = std::type_info::operator==
                    ((type_info *)&std::__cxx11::string::typeinfo,(type_info *)&int::typeinfo);
  if ((!bVar2) &&
     (bVar2 = std::type_info::operator==
                        ((type_info *)&std::__cxx11::string::typeinfo,(type_info *)&float::typeinfo)
     , !bVar2)) {
    std::type_info::operator==
              ((type_info *)&std::__cxx11::string::typeinfo,
               (type_info *)&std::__cxx11::string::typeinfo);
  }
  std::__cxx11::string::assign((char *)&local_68);
  pbVar1 = (argumentNames->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)nextName;
  if ((uVar3 < (ulong)((long)(argumentNames->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) &&
     (pbVar1[uVar3]._M_string_length != 0)) {
    std::operator+(&bStack_88," ",pbVar1 + uVar3);
    std::__cxx11::string::append((string *)&local_68);
    std::__cxx11::string::~string((string *)&bStack_88);
  }
  std::__cxx11::string::append((char *)&local_68);
  if (nextName == requiredArguments) {
    std::operator+(&bStack_88,"[",&local_68);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&bStack_88);
    std::__cxx11::string::~string((string *)&bStack_88);
  }
  std::operator+(&bStack_88," ",&local_68);
  NameArguments<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  get(&local_48,argumentNames,nextName + 1,requiredArguments);
  std::operator+(__return_storage_ptr__,&bStack_88,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string get(const std::vector<std::string> &argumentNames, unsigned int nextName, unsigned int requiredArguments) {
        std::string nameT;
        if (typeid(T) == typeid(int)) {
            nameT = "<int";
        }
        else if (typeid(T) == typeid(float)) {
            nameT = "<float";
        }
        else if (typeid(T) == typeid(std::string)) {
            nameT = "<string";
        }
        else {
            nameT = "<???";
        }
        if (argumentNames.size() > nextName && !argumentNames[nextName].empty()) {
            nameT += " " + argumentNames[nextName];
        }
        nameT += ">";

        if (nextName == requiredArguments) {
            nameT = "[" + nameT;
        }

        return " " + nameT + NameArguments<Args...>::get(argumentNames, nextName + 1, requiredArguments);
    }